

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

void Sbd_StoFree(Sbd_Sto_t *p)

{
  Sbd_Sto_t *p_local;
  
  Vec_IntFree(p->vDelays);
  Vec_IntFree(p->vLevels);
  Vec_IntFree(p->vRefs);
  Vec_WecFree(p->vCuts);
  if (p->fCutMin != 0) {
    Vec_MemHashFree(p->vTtMem);
  }
  if (p->fCutMin != 0) {
    Vec_MemFree(p->vTtMem);
  }
  if (p != (Sbd_Sto_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Sbd_StoFree( Sbd_Sto_t * p )
{
    Vec_IntFree( p->vDelays );
    Vec_IntFree( p->vLevels );
    Vec_IntFree( p->vRefs );
    Vec_WecFree( p->vCuts );
    if ( p->fCutMin )
        Vec_MemHashFree( p->vTtMem );
    if ( p->fCutMin )
        Vec_MemFree( p->vTtMem );
    ABC_FREE( p );
}